

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::BSTinsert
          (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,node *curr,
          value_type *val)

{
  undefined8 uVar1;
  value_type vVar2;
  value_type vVar3;
  int *in_RCX;
  undefined8 extraout_RDX;
  undefined1 uVar4;
  value_type vVar5;
  value_type *pvVar6;
  pair<ft::treeNode<ft::pair<const_int,_int>_>_*,_bool> pVar7;
  
  vVar3.first = curr->colour;
  vVar3.second = *(second_type *)&curr->field_0xc;
  curr->right->parent->left = (treeNode<ft::pair<const_int,_int>_> *)vVar3;
  curr->parent->parent->right = (treeNode<ft::pair<const_int,_int>_> *)vVar3;
  vVar5 = vVar3;
  if (vVar3 != (value_type)val) {
    do {
      vVar5 = (value_type)val;
      if (*(int *)vVar5 == *in_RCX) {
        uVar4 = 0;
        goto LAB_0010b702;
      }
      val = (value_type *)((value_type *)((long)vVar5 + 0x10))[*(int *)vVar5 <= *in_RCX];
    } while (((value_type *)((long)vVar5 + 0x10))[*(int *)vVar5 <= *in_RCX] != vVar3);
  }
  vVar3 = (value_type)operator_new(0x28);
  uVar1 = *(undefined8 *)in_RCX;
  *(undefined8 *)vVar3 = uVar1;
  *(int *)((long)vVar3 + 8) = 0;
  ((int *)((long)vVar3 + 0x10))[0] = 0;
  ((int *)((long)vVar3 + 0x10))[1] = 0;
  ((int *)((long)vVar3 + 0x18))[0] = 0;
  ((int *)((long)vVar3 + 0x18))[1] = 0;
  *(value_type *)((long)vVar3 + 0x20) = vVar5;
  vVar2.first = curr->colour;
  vVar2.second = *(second_type *)&curr->field_0xc;
  if (vVar5 == vVar2) {
    pvVar6 = (value_type *)&curr->left;
  }
  else if ((int)uVar1 < *(int *)vVar5) {
    pvVar6 = (value_type *)((long)vVar5 + 0x10);
  }
  else {
    pvVar6 = (value_type *)((long)vVar5 + 0x18);
  }
  *pvVar6 = vVar3;
  *(value_type *)((long)vVar3 + 0x10) = vVar2;
  *(value_type *)((long)vVar3 + 0x18) = vVar2;
  uVar4 = 1;
  vVar5 = vVar3;
LAB_0010b702:
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ::attach((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            *)curr);
  (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
  super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  ._vptr_treeBase = (_func_int **)vVar5;
  *(undefined1 *)
   &(this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
    super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
    .m_tree.NIL = uVar4;
  pVar7._8_8_ = extraout_RDX;
  pVar7.first = (first_type)this;
  return pVar7;
}

Assistant:

ft::pair<node*, bool>	BSTinsert(node* curr, value_type const & val) {
		this->detach();

		node*	p = this->NIL();

		while (curr != this->NIL()) {
			p = curr;
			if (this->equal(val, curr->value)) {
				this->attach();
				return ft::make_pair(curr, false);
			}
			else if (this->value_comp()(val, curr->value))
				curr = curr->left;
			else
				curr = curr->right;
		}

		node*	newNode = this->m_alloc.allocate(1);
		this->m_alloc.construct(newNode, val);

		newNode->parent = p;

		if (p == this->NIL())
			this->m_tree.m_root = newNode;
		else if (this->value_comp()(newNode->value, p->value))
			p->left = newNode;
		else
			p->right = newNode;

		newNode->left = this->NIL();
		newNode->right = this->NIL();

		this->attach();

		return ft::make_pair(newNode, true);
	}